

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

Point3fi * __thiscall
pbrt::Transform::operator()(Point3fi *__return_storage_ptr__,Transform *this,Point3fi *p)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  Vector3f VVar36;
  Tuple3<pbrt::Vector3,_float> local_88;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  Point3f local_3c;
  Point3f local_30 [2];
  undefined1 auVar21 [56];
  undefined1 auVar25 [60];
  
  auVar3._0_4_ = (p->super_Point3<pbrt::Interval<float>_>).
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar3._4_4_ = (p->super_Point3<pbrt::Interval<float>_>).
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar3._8_4_ = (p->super_Point3<pbrt::Interval<float>_>).
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar3._12_4_ =
       (p->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
       y.high;
  uVar1 = *(undefined8 *)
           &(p->super_Point3<pbrt::Interval<float>_>).
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                              high),0x10);
  auVar15._0_4_ = (float)uVar1 + auVar3._0_4_;
  auVar15._4_4_ = (float)((ulong)uVar1 >> 0x20) + auVar3._4_4_;
  auVar15._8_4_ = auVar3._8_4_ + 0.0;
  auVar15._12_4_ = auVar3._12_4_ + 0.0;
  auVar13._8_4_ = 0x3f000000;
  auVar13._0_8_ = 0x3f0000003f000000;
  auVar13._12_4_ = 0x3f000000;
  _local_58 = vmulps_avx512vl(auVar15,auVar13);
  fVar6 = ((p->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
          (p->super_Point3<pbrt::Interval<float>_>).
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  local_68 = ZEXT416((uint)fVar6);
  auVar3 = vfmadd213ss_fma(ZEXT416((uint)(this->m).m[1][2]),local_68,
                           ZEXT416((uint)(this->m).m[1][3]));
  _local_78 = vmovshdup_avx(_local_58);
  fVar14 = local_78._0_4_;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * (this->m).m[0][1])),_local_58,
                           ZEXT416((uint)(this->m).m[0][0]));
  auVar28 = ZEXT416((uint)fVar6);
  auVar13 = vfmadd213ss_fma(ZEXT416((uint)(this->m).m[3][2]),auVar28,
                            ZEXT416((uint)(this->m).m[3][3]));
  auVar25 = ZEXT1260(auVar13._4_12_);
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)(this->m).m[0][2]),auVar28,
                            ZEXT416((uint)(this->m).m[0][3]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * (this->m).m[1][1])),_local_58,
                           ZEXT416((uint)(this->m).m[1][0]));
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * (this->m).m[2][1])),_local_58,
                           ZEXT416((uint)(this->m).m[2][0]));
  auVar28 = vfmadd213ss_fma(ZEXT416((uint)(this->m).m[2][2]),auVar28,
                            ZEXT416((uint)(this->m).m[2][3]));
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * (this->m).m[3][1])),_local_58,
                            ZEXT416((uint)(this->m).m[3][0]));
  fVar6 = auVar10._0_4_ + auVar13._0_4_;
  auVar21 = (undefined1  [56])0x0;
  bVar11 = Point3fi::IsExact(p);
  if (bVar11) {
    auVar32._8_4_ = 0x7fffffff;
    auVar32._0_8_ = 0x7fffffff7fffffff;
    auVar32._12_4_ = 0x7fffffff;
    auVar13 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 1),
                            ZEXT416((uint)(this->m).m[1][1]),0x10);
    auVar10 = vinsertps_avx((undefined1  [16])(this->m).m[0],ZEXT416((uint)(this->m).m[1][0]),0x10);
    auVar4 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 2),
                           ZEXT416((uint)(this->m).m[1][2]),0x10);
    auVar22._0_4_ = auVar13._0_4_ * (float)local_78._0_4_;
    auVar22._4_4_ = auVar13._4_4_ * (float)local_78._4_4_;
    auVar22._8_4_ = auVar13._8_4_ * fStack_70;
    auVar22._12_4_ = auVar13._12_4_ * fStack_6c;
    auVar16._0_4_ = (float)local_58._0_4_ * auVar10._0_4_;
    auVar16._4_4_ = (float)local_58._0_4_ * auVar10._4_4_;
    auVar16._8_4_ = (float)local_58._0_4_ * auVar10._8_4_;
    auVar16._12_4_ = (float)local_58._0_4_ * auVar10._12_4_;
    auVar13 = vandps_avx(auVar22,auVar32);
    auVar10 = vandps_avx(auVar16,auVar32);
    auVar23._0_4_ = (float)local_68._0_4_ * auVar4._0_4_;
    auVar23._4_4_ = (float)local_68._0_4_ * auVar4._4_4_;
    auVar23._8_4_ = (float)local_68._0_4_ * auVar4._8_4_;
    auVar23._12_4_ = (float)local_68._0_4_ * auVar4._12_4_;
    auVar4 = vandps_avx(auVar23,auVar32);
    auVar19 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 3),
                            ZEXT416((uint)(this->m).m[1][3]),0x10);
    auVar19 = vandps_avx(auVar19,auVar32);
    auVar17._0_4_ = auVar19._0_4_ + auVar10._0_4_ + auVar13._0_4_ + auVar4._0_4_;
    auVar17._4_4_ = auVar19._4_4_ + auVar10._4_4_ + auVar13._4_4_ + auVar4._4_4_;
    auVar17._8_4_ = auVar19._8_4_ + auVar10._8_4_ + auVar13._8_4_ + auVar4._8_4_;
    auVar17._12_4_ = auVar19._12_4_ + auVar10._12_4_ + auVar13._12_4_ + auVar4._12_4_;
    auVar5._8_4_ = 0x34400002;
    auVar5._0_8_ = 0x3440000234400002;
    auVar5._12_4_ = 0x34400002;
    auVar12 = vmulps_avx512vl(auVar17,auVar5);
    uVar1 = *(undefined8 *)(this->m).m[2];
    auVar18._0_4_ = (float)local_58._0_4_ * (float)uVar1;
    auVar18._4_4_ = (float)local_58._4_4_ * (float)((ulong)uVar1 >> 0x20);
    auVar18._8_4_ = fStack_50 * 0.0;
    auVar18._12_4_ = fStack_4c * 0.0;
    auVar13 = vandps_avx(ZEXT416((uint)((float)local_68._0_4_ * (this->m).m[2][2])),auVar32);
    auVar10 = vandps_avx(auVar18,auVar32);
    auVar4 = vhaddps_avx(auVar10,auVar10);
    auVar10 = vandps_avx(ZEXT416((uint)(this->m).m[2][3]),auVar32);
    local_88.z = (auVar10._0_4_ + auVar4._0_4_ + auVar13._0_4_) * 1.7881396e-07;
  }
  else {
    VVar36 = Point3fi::Error(p);
    auVar24._0_4_ = VVar36.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar24._4_60_ = auVar25;
    auVar20._0_8_ = VVar36.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar20._8_56_ = auVar21;
    auVar33._8_4_ = 0x7fffffff;
    auVar33._0_8_ = 0x7fffffff7fffffff;
    auVar33._12_4_ = 0x7fffffff;
    auVar5 = vmovshdup_avx(auVar20._0_16_);
    fVar14 = VVar36.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar35._4_4_ = fVar14;
    auVar35._0_4_ = fVar14;
    auVar35._8_4_ = fVar14;
    auVar35._12_4_ = fVar14;
    auVar10 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 1),
                            ZEXT416((uint)(this->m).m[1][1]),0x10);
    auVar4 = vinsertps_avx((undefined1  [16])(this->m).m[0],ZEXT416((uint)(this->m).m[1][0]),0x10);
    auVar19 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 2),
                            ZEXT416((uint)(this->m).m[1][2]),0x10);
    auVar13 = vandps_avx(auVar10,auVar33);
    auVar29._0_4_ = auVar10._0_4_ * (float)local_78._0_4_;
    auVar29._4_4_ = auVar10._4_4_ * (float)local_78._4_4_;
    auVar29._8_4_ = auVar10._8_4_ * fStack_70;
    auVar29._12_4_ = auVar10._12_4_ * fStack_6c;
    auVar10 = vandps_avx(auVar4,auVar33);
    auVar12._0_4_ = auVar13._0_4_ * auVar5._0_4_;
    auVar12._4_4_ = auVar13._4_4_ * auVar5._4_4_;
    auVar12._8_4_ = auVar13._8_4_ * auVar5._8_4_;
    auVar12._12_4_ = auVar13._12_4_ * auVar5._12_4_;
    auVar10 = vfmadd213ps_fma(auVar35,auVar10,auVar12);
    auVar34._4_4_ = auVar24._0_4_;
    auVar34._0_4_ = auVar24._0_4_;
    auVar34._8_4_ = auVar24._0_4_;
    auVar34._12_4_ = auVar24._0_4_;
    auVar13 = vandps_avx(auVar19,auVar33);
    auVar12 = vfmadd213ps_fma(auVar34,auVar13,auVar10);
    auVar26._0_4_ = (float)local_58._0_4_ * auVar4._0_4_;
    auVar26._4_4_ = (float)local_58._0_4_ * auVar4._4_4_;
    auVar26._8_4_ = (float)local_58._0_4_ * auVar4._8_4_;
    auVar26._12_4_ = (float)local_58._0_4_ * auVar4._12_4_;
    auVar13 = vandps_avx(auVar29,auVar33);
    auVar10 = vandps_avx(auVar26,auVar33);
    auVar30._0_4_ = (float)local_68._0_4_ * auVar19._0_4_;
    auVar30._4_4_ = (float)local_68._0_4_ * auVar19._4_4_;
    auVar30._8_4_ = (float)local_68._0_4_ * auVar19._8_4_;
    auVar30._12_4_ = (float)local_68._0_4_ * auVar19._12_4_;
    auVar4 = vandps_avx(auVar30,auVar33);
    auVar19 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 3),
                            ZEXT416((uint)(this->m).m[1][3]),0x10);
    uVar2 = *(ulong *)(this->m).m[2];
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar2;
    auVar19 = vandps_avx(auVar19,auVar33);
    auVar26 = vandps_avx(auVar31,auVar33);
    auVar27._0_4_ = auVar19._0_4_ + auVar10._0_4_ + auVar13._0_4_ + auVar4._0_4_;
    auVar27._4_4_ = auVar19._4_4_ + auVar10._4_4_ + auVar13._4_4_ + auVar4._4_4_;
    auVar27._8_4_ = auVar19._8_4_ + auVar10._8_4_ + auVar13._8_4_ + auVar4._8_4_;
    auVar27._12_4_ = auVar19._12_4_ + auVar10._12_4_ + auVar13._12_4_ + auVar4._12_4_;
    auVar10._8_4_ = 0x34400002;
    auVar10._0_8_ = 0x3440000234400002;
    auVar10._12_4_ = 0x34400002;
    auVar13 = vmulps_avx512vl(auVar27,auVar10);
    fVar14 = (this->m).m[2][2];
    auVar4._8_4_ = 0x3f800002;
    auVar4._0_8_ = 0x3f8000023f800002;
    auVar4._12_4_ = 0x3f800002;
    auVar12 = vfmadd231ps_avx512vl(auVar13,auVar12,auVar4);
    auVar13 = vmovshdup_avx(auVar31);
    auVar13 = vandps_avx(auVar13,auVar33);
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ * auVar5._0_4_)),auVar20._0_16_,auVar26);
    auVar19._0_4_ = (float)local_58._0_4_ * (float)uVar2;
    auVar19._4_4_ = (float)local_58._4_4_ * (float)(uVar2 >> 0x20);
    auVar19._8_4_ = fStack_50 * 0.0;
    auVar19._12_4_ = fStack_4c * 0.0;
    auVar13 = vandps_avx(ZEXT416((uint)fVar14),auVar33);
    auVar10 = vandps_avx(auVar19,auVar33);
    auVar19 = vfmadd231ss_fma(auVar4,auVar24._0_16_,auVar13);
    auVar4 = vhaddps_avx(auVar10,auVar10);
    auVar13 = vandps_avx(ZEXT416((uint)((float)local_68._0_4_ * fVar14)),auVar33);
    auVar10 = vandps_avx(ZEXT416((uint)(this->m).m[2][3]),auVar33);
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)((auVar10._0_4_ + auVar4._0_4_ + auVar13._0_4_) *
                                            1.7881396e-07)),auVar19,ZEXT416(0x3f800002));
    local_88.z = auVar13._0_4_;
  }
  local_88._0_8_ = vmovlps_avx(auVar12);
  local_3c.super_Tuple3<pbrt::Point3,_float>.x = auVar15._0_4_ + auVar7._0_4_;
  local_3c.super_Tuple3<pbrt::Point3,_float>.y = auVar8._0_4_ + auVar3._0_4_;
  local_3c.super_Tuple3<pbrt::Point3,_float>.z = auVar28._0_4_ + auVar9._0_4_;
  if ((fVar6 != 1.0) || (NAN(fVar6))) {
    Point3fi::Point3fi((Point3fi *)local_30,&local_3c,(Vector3f *)&local_88);
    Tuple3<pbrt::Point3,pbrt::Interval<float>>::operator/
              (&__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>,
               (Tuple3<pbrt::Point3,pbrt::Interval<float>> *)local_30,fVar6);
  }
  else {
    local_30[0].super_Tuple3<pbrt::Point3,_float>.x = local_3c.super_Tuple3<pbrt::Point3,_float>.x;
    local_30[0].super_Tuple3<pbrt::Point3,_float>.y = local_3c.super_Tuple3<pbrt::Point3,_float>.y;
    local_30[0].super_Tuple3<pbrt::Point3,_float>.z = local_3c.super_Tuple3<pbrt::Point3,_float>.z;
    Point3fi::Point3fi(__return_storage_ptr__,local_30,(Vector3f *)&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    Point3fi operator()(const Point3fi &p) const {
        Float x = Float(p.x), y = Float(p.y), z = Float(p.z);
        // Compute transformed coordinates from point _pt_
        Float xp = (m[0][0] * x + m[0][1] * y) + (m[0][2] * z + m[0][3]);
        Float yp = (m[1][0] * x + m[1][1] * y) + (m[1][2] * z + m[1][3]);
        Float zp = (m[2][0] * x + m[2][1] * y) + (m[2][2] * z + m[2][3]);
        Float wp = (m[3][0] * x + m[3][1] * y) + (m[3][2] * z + m[3][3]);

        // Compute absolute error for transformed point, _pError_
        Vector3f pError;
        if (p.IsExact()) {
            // Compute error for transformed exact _p_
            pError.x = gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                   std::abs(m[0][2] * z) + std::abs(m[0][3]));
            pError.y = gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                   std::abs(m[1][2] * z) + std::abs(m[1][3]));
            pError.z = gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                   std::abs(m[2][2] * z) + std::abs(m[2][3]));

        } else {
            // Compute error for transformed approximate _p_
            Vector3f pInError = p.Error();
            pError.x = (gamma(3) + 1) * (std::abs(m[0][0]) * pInError.x +
                                         std::abs(m[0][1]) * pInError.y +
                                         std::abs(m[0][2]) * pInError.z) +
                       gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                   std::abs(m[0][2] * z) + std::abs(m[0][3]));
            pError.y = (gamma(3) + 1) * (std::abs(m[1][0]) * pInError.x +
                                         std::abs(m[1][1]) * pInError.y +
                                         std::abs(m[1][2]) * pInError.z) +
                       gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                   std::abs(m[1][2] * z) + std::abs(m[1][3]));
            pError.z = (gamma(3) + 1) * (std::abs(m[2][0]) * pInError.x +
                                         std::abs(m[2][1]) * pInError.y +
                                         std::abs(m[2][2]) * pInError.z) +
                       gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                   std::abs(m[2][2] * z) + std::abs(m[2][3]));
        }

        if (wp == 1)
            return Point3fi(Point3f(xp, yp, zp), pError);
        else
            return Point3fi(Point3f(xp, yp, zp), pError) / wp;
    }